

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O3

Vec4 __thiscall glcts::BlendDifference(glcts *this,Vec4 *src,Vec4 *dst)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  Vec4 VVar5;
  Vec4 local_18;
  
  fVar3 = src->m_data[2] - dst->m_data[2];
  uVar1 = -(uint)(-fVar3 <= fVar3);
  local_18.m_data[2] = (float)(~uVar1 & (uint)-fVar3 | (uint)fVar3 & uVar1);
  fVar3 = (float)*(undefined8 *)src->m_data - (float)*(undefined8 *)dst->m_data;
  fVar4 = (float)((ulong)*(undefined8 *)src->m_data >> 0x20) -
          (float)((ulong)*(undefined8 *)dst->m_data >> 0x20);
  uVar1 = -(uint)(-fVar3 <= fVar3);
  uVar2 = -(uint)(-fVar4 <= fVar4);
  local_18.m_data._0_8_ =
       CONCAT44(~uVar2 & (uint)-fVar4,~uVar1 & (uint)-fVar3) |
       CONCAT44((uint)fVar4 & uVar2,(uint)fVar3 & uVar1);
  local_18.m_data[3] = 0.0;
  VVar5 = Blend(&local_18,src,dst);
  return (Vec4)VVar5.m_data;
}

Assistant:

static tcu::Vec4 BlendDifference(const tcu::Vec4& src, const tcu::Vec4& dst)
{
	tcu::Vec4 rgb(deFloatAbs(src[0] - dst[0]), deFloatAbs(src[1] - dst[1]), deFloatAbs(src[2] - dst[2]), 0.f);

	return Blend(rgb, src, dst);
}